

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmContinueCommand.cxx
# Opt level: O2

bool cmContinueCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  allocator<char> local_31;
  string local_30;
  
  bVar2 = cmMakefile::IsLoopBlock(status->Makefile);
  if (bVar2) {
    status->ContinueInvoked = true;
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    pcVar1 = status->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"The CONTINUE command does not accept any arguments.",&local_31);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_30);
  }
  else {
    pcVar1 = status->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "A CONTINUE command was found outside of a proper FOREACH or WHILE loop scope.",
               &local_31);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  cmSystemTools::s_FatalErrorOccurred = true;
  return true;
}

Assistant:

bool cmContinueCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (!status.GetMakefile().IsLoopBlock()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "A CONTINUE command was found outside of a "
      "proper FOREACH or WHILE loop scope.");
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  status.SetContinueInvoked();

  if (!args.empty()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "The CONTINUE command does not accept any "
      "arguments.");
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  return true;
}